

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_metadata.cpp
# Opt level: O2

void __thiscall
duckdb::ArrowSchemaMetadata::ArrowSchemaMetadata(ArrowSchemaMetadata *this,char *metadata)

{
  int iVar1;
  __uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> __p;
  mapped_type *pmVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  bool bVar6;
  string key;
  string value;
  allocator local_79;
  unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>,_true> *local_78;
  key_type local_70;
  __uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> local_50 [2];
  undefined1 local_40 [16];
  
  (this->schema_metadata_map)._M_h._M_buckets = &(this->schema_metadata_map)._M_h._M_single_bucket;
  (this->schema_metadata_map)._M_h._M_bucket_count = 1;
  (this->schema_metadata_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->schema_metadata_map)._M_h._M_element_count = 0;
  (this->schema_metadata_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extension_metadata_map).
  super_unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>._M_t.
  super___uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
  super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl = (ComplexJSON *)0x0;
  local_78 = &this->extension_metadata_map;
  (this->schema_metadata_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->schema_metadata_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (metadata != (char *)0x0) {
    iVar4 = 0;
    if (0 < *(int *)metadata) {
      iVar4 = *(int *)metadata;
    }
    piVar5 = (int *)(metadata + 4);
    while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
      iVar1 = *piVar5;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      piVar3 = (int *)((long)piVar5 + (long)iVar1 + 4);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,piVar5 + 1,piVar3);
      local_50[0]._M_t.
      super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
      super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
           (tuple<duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>)local_40;
      piVar3 = (int *)((long)piVar3 + (long)*piVar3 + 4);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,(long)piVar5 + (long)iVar1 + 8,piVar3);
      pmVar2 = ::std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,&local_70);
      ::std::__cxx11::string::_M_assign((string *)pmVar2);
      ::std::__cxx11::string::~string((string *)local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
      piVar5 = piVar3;
    }
  }
  ::std::__cxx11::string::string((string *)&local_70,"ARROW:extension:name",(allocator *)local_50);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,&local_70);
  bVar6 = ::std::operator!=(pmVar2,"arrow.opaque");
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::string((string *)&local_70,"ARROW:extension:metadata",&local_79);
  pmVar2 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this,&local_70);
  StringUtil::ParseJSONMap((StringUtil *)local_50,(string *)pmVar2,bVar6);
  __p._M_t.super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
  super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
       local_50[0]._M_t.
       super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
       super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl;
  local_50[0]._M_t.
  super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>.
  super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl =
       (tuple<duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>)
       (_Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::reset
            ((__uniq_ptr_impl<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> *)
             local_78,(pointer)__p._M_t.
                               super__Tuple_impl<0UL,_duckdb::ComplexJSON_*,_std::default_delete<duckdb::ComplexJSON>_>
                               .super__Head_base<0UL,_duckdb::ComplexJSON_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_>::~unique_ptr
            ((unique_ptr<duckdb::ComplexJSON,_std::default_delete<duckdb::ComplexJSON>_> *)local_50)
  ;
  ::std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

ArrowSchemaMetadata::ArrowSchemaMetadata(const char *metadata) {
	if (metadata) {
		// Read the number of key-value pairs (int32)
		int32_t num_pairs;
		memcpy(&num_pairs, metadata, sizeof(int32_t));
		metadata += sizeof(int32_t);

		// Loop through each key-value pair
		for (int32_t i = 0; i < num_pairs; ++i) {
			// Read the length of the key (int32)
			int32_t key_length;
			memcpy(&key_length, metadata, sizeof(int32_t));
			metadata += sizeof(int32_t);

			// Read the key
			std::string key(metadata, static_cast<idx_t>(key_length));
			metadata += key_length;

			// Read the length of the value (int32)
			int32_t value_length;
			memcpy(&value_length, metadata, sizeof(int32_t));
			metadata += sizeof(int32_t);

			// Read the value
			const std::string value(metadata, static_cast<idx_t>(value_length));
			metadata += value_length;
			schema_metadata_map[key] = value;
		}
	}
	// We ignore errors of the metadata parsing if the extension is different from arrow.opaque
	const bool ignore_errors =
	    schema_metadata_map[ARROW_EXTENSION_NAME] != ArrowExtensionMetadata::ARROW_EXTENSION_NON_CANONICAL;
	extension_metadata_map = StringUtil::ParseJSONMap(schema_metadata_map[ARROW_METADATA_KEY], ignore_errors);
}